

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double orient3dexact(double *pa,double *pb,double *pc,double *pd)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double temp8 [8];
  double dab [12];
  double cda [12];
  double abc [12];
  double cdet [24];
  double bdet [24];
  double adet [24];
  double bcd [12];
  double ddet [24];
  double deter [96];
  double cddet [48];
  double abdet [48];
  double dStack_c40;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  double local_ba8;
  double local_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  double local_b88;
  double local_b80;
  double local_b78;
  double dStack_b70;
  double local_b68;
  double local_b60;
  double local_b58;
  double dStack_b50;
  double local_b48;
  double local_b40;
  double local_b38;
  double dStack_b30;
  double local_b28;
  double local_b20;
  double local_b18 [8];
  double local_ad8;
  double dStack_ad0;
  double local_ac8;
  double local_ac0;
  double local_ab8 [12];
  double local_a58 [12];
  double local_9f8 [12];
  double local_998 [24];
  double local_8d8 [24];
  double local_818 [24];
  double local_758 [12];
  double local_6f8 [23];
  double adStack_640 [97];
  double local_338 [48];
  double local_1b8 [49];
  
  dVar31 = *pb;
  dVar32 = pb[1];
  dVar12 = *pa;
  dVar15 = pa[1];
  dVar17 = dVar32 * dVar12;
  dVar30 = dVar31 * dVar15;
  dVar16 = splitter * dVar32 - (splitter * dVar32 - dVar32);
  dVar20 = splitter * dVar31 - (splitter * dVar31 - dVar31);
  dVar36 = dVar32 - dVar16;
  dVar37 = dVar31 - dVar20;
  dVar22 = splitter * dVar12 - (splitter * dVar12 - dVar12);
  dVar24 = splitter * dVar15 - (splitter * dVar15 - dVar15);
  dVar38 = dVar12 - dVar22;
  dVar40 = dVar15 - dVar24;
  dVar23 = dVar36 * dVar38 - (((dVar17 - dVar22 * dVar16) - dVar38 * dVar16) - dVar36 * dVar22);
  dVar25 = dVar37 * dVar40 - (((dVar30 - dVar20 * dVar24) - dVar37 * dVar24) - dVar40 * dVar20);
  dVar26 = dVar23 - dVar25;
  dVar9 = dVar17 + dVar26;
  dVar17 = (dVar17 - (dVar9 - (dVar9 - dVar17))) + (dVar26 - (dVar9 - dVar17));
  dVar18 = dVar17 - dVar30;
  dVar22 = -dVar22;
  dVar20 = -dVar20;
  local_b38 = (dVar23 - (dVar26 + (dVar23 - dVar26))) + ((dVar23 - dVar26) - dVar25);
  dStack_b30 = (dVar17 - (dVar18 + (dVar17 - dVar18))) + ((dVar17 - dVar18) - dVar30);
  local_b20 = dVar9 + dVar18;
  local_b28 = (dVar9 - (local_b20 - (local_b20 - dVar9))) + (dVar18 - (local_b20 - dVar9));
  dVar9 = *pc;
  dVar18 = pc[1];
  dVar26 = splitter * dVar9 - (splitter * dVar9 - dVar9);
  dVar13 = splitter * dVar18 - (splitter * dVar18 - dVar18);
  dVar23 = *pd;
  dVar25 = pd[1];
  dVar33 = splitter * dVar25 - (splitter * dVar25 - dVar25);
  dVar35 = splitter * dVar23 - (splitter * dVar23 - dVar23);
  dVar19 = -dVar26;
  dVar21 = -dVar35;
  dVar10 = dVar9 - dVar26;
  dVar14 = dVar18 - dVar13;
  dVar27 = dVar25 - dVar33;
  dVar29 = dVar23 - dVar35;
  auVar1._8_4_ = SUB84(dVar36,0);
  auVar1._0_8_ = dVar27;
  auVar1._12_4_ = (int)((ulong)dVar36 >> 0x20);
  dVar28 = dVar32 * dVar9;
  dVar30 = dVar31 * dVar18;
  dVar39 = dVar36 * dVar10 - (dVar19 * dVar36 + -dVar10 * dVar16 + dVar19 * dVar16 + dVar28);
  dVar41 = dVar37 * dVar14 - (dVar14 * dVar20 + dVar13 * -dVar37 + dVar13 * dVar20 + dVar30);
  dVar17 = dVar41 - dVar39;
  dVar34 = dVar30 + dVar17;
  dVar30 = (dVar30 - (dVar34 - (dVar34 - dVar30))) + (dVar17 - (dVar34 - dVar30));
  dVar11 = dVar30 - dVar28;
  local_b78 = (dVar41 - (dVar17 + (dVar41 - dVar17))) + ((dVar41 - dVar17) - dVar39);
  dStack_b70 = (dVar30 - ((dVar30 - dVar11) + dVar11)) + ((dVar30 - dVar11) - dVar28);
  local_b60 = dVar34 + dVar11;
  local_b68 = (dVar34 - (local_b60 - (local_b60 - dVar34))) + (dVar11 - (local_b60 - dVar34));
  dVar17 = dVar9 * dVar25;
  dVar30 = dVar18 * dVar23;
  dVar34 = dVar10 * dVar27 - (((dVar17 - dVar26 * dVar33) - dVar33 * dVar10) - dVar27 * dVar26);
  dVar35 = dVar14 * dVar29 - (((dVar30 - dVar35 * dVar13) - dVar13 * dVar29) - dVar14 * dVar35);
  dVar11 = dVar34 - dVar35;
  dVar26 = dVar17 + dVar11;
  dVar17 = (dVar17 - (dVar26 - (dVar26 - dVar17))) + (dVar11 - (dVar26 - dVar17));
  dVar28 = dVar17 - dVar30;
  local_b58 = (dVar34 - (dVar11 + (dVar34 - dVar11))) + ((dVar34 - dVar11) - dVar35);
  dStack_b50 = (dVar17 - (dVar28 + (dVar17 - dVar28))) + ((dVar17 - dVar28) - dVar30);
  local_b40 = dVar26 + dVar28;
  local_b48 = (dVar26 - (local_b40 - (local_b40 - dVar26))) + (dVar28 - (local_b40 - dVar26));
  dVar18 = dVar18 * dVar12;
  dVar9 = dVar9 * dVar15;
  dVar12 = dVar12 * dVar25;
  dVar15 = dVar15 * dVar23;
  dVar28 = dVar38 * dVar27 - (dVar27 * dVar22 + -dVar38 * dVar33 + dVar22 * dVar33 + dVar12);
  dVar34 = dVar40 * dVar29 - (dVar40 * dVar21 + -dVar29 * dVar24 + dVar21 * dVar24 + dVar15);
  dVar11 = dVar34 - dVar28;
  dVar26 = dVar15 + dVar11;
  dVar17 = (dVar15 - (dVar26 - (dVar26 - dVar15))) + (dVar11 - (dVar26 - dVar15));
  dVar30 = dVar17 - dVar12;
  local_ad8 = (dVar34 - (dVar11 + (dVar34 - dVar11))) + ((dVar34 - dVar11) - dVar28);
  dStack_ad0 = (dVar17 - ((dVar17 - dVar30) + dVar30)) + ((dVar17 - dVar30) - dVar12);
  local_ac0 = dVar26 + dVar30;
  local_ac8 = (dVar26 - (local_ac0 - (local_ac0 - dVar26))) + (dVar30 - (local_ac0 - dVar26));
  dVar30 = dVar14 * dVar38 - (dVar14 * dVar22 + -dVar38 * dVar13 + dVar22 * dVar13 + dVar18);
  dVar15 = dVar10 * dVar40 - (dVar40 * dVar19 + -dVar10 * dVar24 + dVar19 * dVar24 + dVar9);
  dVar10 = dVar30 - dVar15;
  dVar26 = dVar18 + dVar10;
  dVar17 = (dVar18 - (dVar26 - (dVar26 - dVar18))) + (dVar10 - (dVar26 - dVar18));
  dVar12 = dVar17 - dVar9;
  local_b98 = (dVar30 - (dVar10 + (dVar30 - dVar10))) + ((dVar30 - dVar10) - dVar15);
  uStack_b90 = (dVar17 - (dVar12 + (dVar17 - dVar12))) + ((dVar17 - dVar12) - dVar9);
  local_b80 = dVar26 + dVar12;
  local_b88 = (dVar26 - (local_b80 - (local_b80 - dVar26))) + (dVar12 - (local_b80 - dVar26));
  dVar25 = dVar25 * dVar31;
  dVar23 = dVar23 * dVar32;
  dStack_c40 = auVar1._8_8_;
  dVar31 = dVar37 * dVar27 - (dVar27 * dVar20 + -dVar37 * dVar33 + dVar20 * dVar33 + dVar25);
  dVar32 = dVar36 * dVar29 - (dStack_c40 * dVar21 + -dVar29 * dVar16 + dVar21 * dVar16 + dVar23);
  dVar15 = dVar31 - dVar32;
  dVar17 = dVar25 + dVar15;
  dVar12 = (dVar25 - (dVar17 - (dVar17 - dVar25))) + (dVar15 - (dVar17 - dVar25));
  dVar30 = dVar12 - dVar23;
  local_bb8 = (dVar31 - (dVar15 + (dVar31 - dVar15))) + ((dVar31 - dVar15) - dVar32);
  uStack_bb0 = (dVar12 - (dVar30 + (dVar12 - dVar30))) + ((dVar12 - dVar30) - dVar23);
  local_ba0 = dVar17 + dVar30;
  local_ba8 = (dVar17 - (local_ba0 - (local_ba0 - dVar17))) + (dVar30 - (local_ba0 - dVar17));
  iVar4 = fast_expansion_sum_zeroelim(4,&local_b58,4,&local_ad8,local_b18);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_b18,4,(double *)&local_b98,local_a58);
  iVar5 = fast_expansion_sum_zeroelim(4,&local_ad8,4,&local_b38,local_b18);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_b18,4,(double *)&local_bb8,local_ab8);
  lVar8 = 0;
  do {
    uVar3 = *(uint *)((long)&local_bb8 + lVar8 * 8 + 4);
    uVar2 = (&uStack_bb0)[lVar8];
    *(undefined4 *)(&local_bb8 + lVar8) = *(undefined4 *)(&local_bb8 + lVar8);
    *(uint *)((long)&local_bb8 + lVar8 * 8 + 4) = uVar3 ^ 0x80000000;
    *(int *)(&uStack_bb0 + lVar8) = (int)uVar2;
    *(uint *)((long)&uStack_bb0 + lVar8 * 8 + 4) = (uint)((ulong)uVar2 >> 0x20) ^ 0x80000000;
    uVar3 = *(uint *)((long)&local_b98 + lVar8 * 8 + 4);
    uVar2 = (&uStack_b90)[lVar8];
    *(undefined4 *)(&local_b98 + lVar8) = *(undefined4 *)(&local_b98 + lVar8);
    *(uint *)((long)&local_b98 + lVar8 * 8 + 4) = uVar3 ^ 0x80000000;
    *(int *)(&uStack_b90 + lVar8) = (int)uVar2;
    *(uint *)((long)&uStack_b90 + lVar8 * 8 + 4) = (uint)((ulong)uVar2 >> 0x20) ^ 0x80000000;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 4);
  iVar6 = fast_expansion_sum_zeroelim(4,&local_b38,4,&local_b78,local_b18);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_b18,4,(double *)&local_b98,local_9f8);
  iVar7 = fast_expansion_sum_zeroelim(4,&local_b78,4,&local_b58,local_b18);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,local_b18,4,(double *)&local_bb8,local_758);
  iVar7 = scale_expansion_zeroelim(iVar7,local_758,pa[2],local_818);
  iVar4 = scale_expansion_zeroelim(iVar4,local_a58,-pb[2],local_8d8);
  iVar5 = scale_expansion_zeroelim(iVar5,local_ab8,pc[2],local_998);
  iVar6 = scale_expansion_zeroelim(iVar6,local_9f8,-pd[2],local_6f8);
  iVar4 = fast_expansion_sum_zeroelim(iVar7,local_818,iVar4,local_8d8,local_1b8);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_998,iVar6,local_6f8,local_338);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_1b8,iVar5,local_338,adStack_640 + 1);
  return adStack_640[iVar4];
}

Assistant:

REAL orient3dexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL adet[24], bdet[24], cdet[24], ddet[24];
  int alen, blen, clen, dlen;
  REAL abdet[48], cddet[48];
  int ablen, cdlen;
  REAL deter[96];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  alen = scale_expansion_zeroelim(bcdlen, bcd, pa[2], adet);
  blen = scale_expansion_zeroelim(cdalen, cda, -pb[2], bdet);
  clen = scale_expansion_zeroelim(dablen, dab, pc[2], cdet);
  dlen = scale_expansion_zeroelim(abclen, abc, -pd[2], ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}